

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 *cr_min,ImVec2 *cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  float fVar2;
  ImVec4 *__src;
  int iVar3;
  ImVec4 *__dest;
  int iVar4;
  undefined7 in_register_00000009;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar7 = cr_max->x;
  fVar6 = cr_max->y;
  fVar10 = (*cr_min).x;
  fVar11 = (*cr_min).y;
  fVar8 = fVar10;
  fVar9 = fVar11;
  fVar12 = fVar10;
  fVar13 = fVar11;
  if ((int)CONCAT71(in_register_00000009,intersect_with_current_clip_rect) != 0) {
    fVar12 = (this->_CmdHeader).ClipRect.x;
    fVar13 = (this->_CmdHeader).ClipRect.y;
    if (fVar10 < fVar12) {
      fVar8 = fVar12;
    }
    fVar1 = (this->_CmdHeader).ClipRect.z;
    fVar2 = (this->_CmdHeader).ClipRect.w;
    if (fVar11 < fVar13) {
      fVar9 = fVar13;
    }
    if (fVar12 <= fVar10) {
      fVar12 = fVar10;
    }
    if (fVar13 <= fVar11) {
      fVar13 = fVar11;
    }
    if (fVar7 <= fVar1) {
      fVar1 = fVar7;
    }
    fVar7 = fVar1;
    if (fVar2 < fVar6) {
      fVar6 = fVar2;
    }
  }
  iVar3 = (this->_ClipRectStack).Size;
  if (iVar3 == (this->_ClipRectStack).Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar5 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar5 << 4);
    __src = (this->_ClipRectStack).Data;
    if (__src != (ImVec4 *)0x0) {
      memcpy(__dest,__src,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest;
    (this->_ClipRectStack).Capacity = iVar5;
    iVar3 = (this->_ClipRectStack).Size;
  }
  else {
    __dest = (this->_ClipRectStack).Data;
  }
  fVar6 = (float)(~-(uint)(fVar6 <= fVar13) & (uint)fVar6 | (uint)fVar13 & -(uint)(fVar6 <= fVar13))
  ;
  fVar7 = (float)(~-(uint)(fVar7 <= fVar12) & (uint)fVar7 | (uint)fVar12 & -(uint)(fVar7 <= fVar12))
  ;
  __dest[iVar3].x = fVar8;
  __dest[iVar3].y = fVar9;
  __dest[iVar3].z = fVar7;
  __dest[iVar3].w = fVar6;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect.x = fVar8;
  (this->_CmdHeader).ClipRect.y = fVar9;
  (this->_CmdHeader).ClipRect.z = fVar7;
  (this->_CmdHeader).ClipRect.w = fVar6;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(const ImVec2& cr_min, const ImVec2& cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}